

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O3

int Abc_CommandAbc9Equiv(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  uint uVar2;
  int *piVar3;
  char *pcVar4;
  char *pcVar5;
  Cec_ParSim_t *pPars;
  int iVar6;
  Cec_ParSim_t Pars;
  Cec_ParSim_t local_68;
  Abc_Frame_t *local_38;
  
  local_38 = pAbc;
  Cec_ManSimSetDefaultParams(&local_68);
  Extra_UtilGetoptReset();
  do {
    while (iVar1 = Extra_UtilGetopt(argc,argv,"WFRSTsmdvh"), iVar6 = globalUtilOptind, 99 < iVar1) {
      if (iVar1 < 0x73) {
        piVar3 = &local_68.fDualOut;
        if ((iVar1 != 100) && (piVar3 = &local_68.fCheckMiter, iVar1 != 0x6d))
        goto switchD_0027b2f8_caseD_55;
      }
      else {
        piVar3 = &local_68.fSeqSimulate;
        if (iVar1 != 0x73) {
          if (iVar1 != 0x76) goto switchD_0027b2f8_caseD_55;
          piVar3 = &local_68.fVerbose;
        }
      }
      *(byte *)piVar3 = (byte)*piVar3 ^ 1;
    }
    switch(iVar1) {
    case 0x52:
      if (argc <= globalUtilOptind) {
        pcVar4 = "Command line switch \"-R\" should be followed by an integer.\n";
LAB_0027b41e:
        Abc_Print(-1,pcVar4);
        goto switchD_0027b2f8_caseD_55;
      }
      uVar2 = atoi(argv[globalUtilOptind]);
      local_68.nRounds = uVar2;
      break;
    case 0x53:
      if (argc <= globalUtilOptind) {
        pcVar4 = "Command line switch \"-S\" should be followed by an integer.\n";
        goto LAB_0027b41e;
      }
      uVar2 = atoi(argv[globalUtilOptind]);
      local_68.nNonRefines = uVar2;
      break;
    case 0x54:
      if (argc <= globalUtilOptind) {
        pcVar4 = "Command line switch \"-T\" should be followed by an integer.\n";
        goto LAB_0027b41e;
      }
      uVar2 = atoi(argv[globalUtilOptind]);
      local_68.TimeLimit = uVar2;
      break;
    case 0x55:
    case 0x56:
      goto switchD_0027b2f8_caseD_55;
    case 0x57:
      if (argc <= globalUtilOptind) {
        pcVar4 = "Command line switch \"-W\" should be followed by an integer.\n";
        goto LAB_0027b41e;
      }
      uVar2 = atoi(argv[globalUtilOptind]);
      local_68.nWords = uVar2;
      break;
    default:
      if (iVar1 != 0x46) {
        if (iVar1 == -1) {
          if (local_38->pGia != (Gia_Man_t *)0x0) {
            Cec_ManSimulation(local_38->pGia,&local_68);
            return 0;
          }
          pcVar4 = "Abc_CommandAbc9Equiv(): There is no AIG.\n";
          iVar6 = -1;
          goto LAB_0027b563;
        }
        goto switchD_0027b2f8_caseD_55;
      }
      if (argc <= globalUtilOptind) {
        pcVar4 = "Command line switch \"-F\" should be followed by an integer.\n";
        goto LAB_0027b41e;
      }
      uVar2 = atoi(argv[globalUtilOptind]);
      local_68.nFrames = uVar2;
    }
    globalUtilOptind = iVar6 + 1;
  } while (-1 < (int)uVar2);
switchD_0027b2f8_caseD_55:
  Abc_Print(-2,"usage: &equiv [-WFRST num] [-smdvh]\n");
  Abc_Print(-2,"\t         computes candidate equivalence classes\n");
  Abc_Print(-2,"\t-W num : the number of words to simulate [default = %d]\n",
            (ulong)(uint)local_68.nWords);
  Abc_Print(-2,"\t-F num : the number of frames to simulate [default = %d]\n",
            (ulong)(uint)local_68.nFrames);
  Abc_Print(-2,"\t-R num : the max number of simulation rounds [default = %d]\n",
            (ulong)(uint)local_68.nRounds);
  Abc_Print(-2,"\t-S num : the max number of rounds w/o refinement to stop [default = %d]\n",
            (ulong)(uint)local_68.nNonRefines);
  Abc_Print(-2,"\t-T num : approximate runtime limit in seconds [default = %d]\n",
            (ulong)(uint)local_68.TimeLimit);
  pcVar5 = "yes";
  pcVar4 = "yes";
  if (local_68.fSeqSimulate == 0) {
    pcVar4 = "no";
  }
  Abc_Print(-2,"\t-s     : toggle seq vs. comb simulation [default = %s]\n",pcVar4);
  pcVar4 = "miter";
  if (local_68.fCheckMiter == 0) {
    pcVar4 = "circuit";
  }
  Abc_Print(-2,"\t-m     : toggle miter vs. any circuit [default = %s]\n",pcVar4);
  pcVar4 = "yes";
  if (local_68.fDualOut == 0) {
    pcVar4 = "no";
  }
  Abc_Print(-2,"\t-d     : toggle using two POs intead of XOR [default = %s]\n",pcVar4);
  if (local_68.fVerbose == 0) {
    pcVar5 = "no";
  }
  Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar5);
  pcVar4 = "\t-h     : print the command usage\n";
  iVar6 = -2;
LAB_0027b563:
  Abc_Print(iVar6,pcVar4);
  return 1;
}

Assistant:

int Abc_CommandAbc9Equiv( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Cec_ParSim_t Pars, * pPars = &Pars;
    int c;
    Cec_ManSimSetDefaultParams( pPars );
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "WFRSTsmdvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'W':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-W\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nWords = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nWords < 0 )
                goto usage;
            break;
        case 'F':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-F\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nFrames = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nFrames < 0 )
                goto usage;
            break;
        case 'R':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-R\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nRounds = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nRounds < 0 )
                goto usage;
            break;
        case 'S':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-S\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nNonRefines = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nNonRefines < 0 )
                goto usage;
            break;
        case 'T':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-T\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->TimeLimit = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->TimeLimit < 0 )
                goto usage;
            break;
        case 's':
            pPars->fSeqSimulate ^= 1;
            break;
        case 'm':
            pPars->fCheckMiter ^= 1;
            break;
        case 'd':
            pPars->fDualOut ^= 1;
            break;
        case 'v':
            pPars->fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9Equiv(): There is no AIG.\n" );
        return 1;
    }
    Cec_ManSimulation( pAbc->pGia, pPars );
    return 0;

usage:
    Abc_Print( -2, "usage: &equiv [-WFRST num] [-smdvh]\n" );
    Abc_Print( -2, "\t         computes candidate equivalence classes\n" );
    Abc_Print( -2, "\t-W num : the number of words to simulate [default = %d]\n", pPars->nWords );
    Abc_Print( -2, "\t-F num : the number of frames to simulate [default = %d]\n", pPars->nFrames );
    Abc_Print( -2, "\t-R num : the max number of simulation rounds [default = %d]\n", pPars->nRounds );
    Abc_Print( -2, "\t-S num : the max number of rounds w/o refinement to stop [default = %d]\n", pPars->nNonRefines );
    Abc_Print( -2, "\t-T num : approximate runtime limit in seconds [default = %d]\n", pPars->TimeLimit );
    Abc_Print( -2, "\t-s     : toggle seq vs. comb simulation [default = %s]\n", pPars->fSeqSimulate? "yes": "no" );
    Abc_Print( -2, "\t-m     : toggle miter vs. any circuit [default = %s]\n", pPars->fCheckMiter? "miter": "circuit" );
    Abc_Print( -2, "\t-d     : toggle using two POs intead of XOR [default = %s]\n", pPars->fDualOut? "yes": "no" );
    Abc_Print( -2, "\t-v     : toggle printing verbose information [default = %s]\n", pPars->fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}